

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pyxll[P]xlfparser/tests/catch.hpp:7727:20)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pyxll[P]xlfparser_tests_catch_hpp:7727:20)>
          *this,string *arg)

{
  int temp;
  ParserResult result;
  int local_4c;
  ParserResult local_48;
  
  local_4c = 0;
  convertInto<int>(&local_48,arg,&local_4c);
  if (local_48.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.m_type
      == Ok) {
    ((this->m_lambda).config)->abortAfter = local_4c;
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001a8640;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
              (__return_storage_ptr__,&local_48);
  }
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(&local_48);
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }